

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_reset(Spi *this)

{
  flash_chip_select(this);
  xfer_spi_bits(this,0xff,8);
  flash_chip_deselect(this);
  flash_chip_select(this);
  xfer_spi_bits(this,0xff,2);
  flash_chip_deselect(this);
  return;
}

Assistant:

void Spi::flash_reset() {
	flash_chip_select();
	xfer_spi_bits(0xFF, 8);
	flash_chip_deselect();

	flash_chip_select();
	xfer_spi_bits(0xFF, 2);
	flash_chip_deselect();
}